

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

int __thiscall Map::GenerateItemID(Map *this)

{
  short sVar1;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar2;
  _List_node_base *p_Var3;
  int iVar4;
  shared_ptr<Map_Item> item;
  
  plVar2 = &this->items;
  iVar4 = 1;
  p_Var3 = (_List_node_base *)plVar2;
  while( true ) {
    p_Var3 = (((_List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *
               )&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar2) break;
    std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 1));
    sVar1 = (item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->uid;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (iVar4 == sVar1) {
      iVar4 = sVar1 + 1;
      p_Var3 = (_List_node_base *)plVar2;
    }
  }
  return iVar4;
}

Assistant:

int Map::GenerateItemID() const
{
	int lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == lowest_free_id)
		{
			lowest_free_id = item->uid + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}